

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

int __thiscall QComboBoxPrivateContainer::spacing(QComboBoxPrivateContainer *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  QListView *this_00;
  QTableView *this_01;
  
  this_00 = QtPrivate::qobject_cast_helper<QListView*,QObject>((QObject *)this->view);
  if (this_00 == (QListView *)0x0) {
    this_01 = QtPrivate::qobject_cast_helper<QTableView*,QObject>((QObject *)this->view);
    if (this_01 == (QTableView *)0x0) {
      uVar3 = 0;
    }
    else {
      bVar1 = QTableView::showGrid(this_01);
      uVar3 = (uint)bVar1;
    }
  }
  else {
    iVar2 = QListView::spacing(this_00);
    uVar3 = iVar2 * 2;
  }
  return uVar3;
}

Assistant:

int QComboBoxPrivateContainer::spacing() const
{
    QListView *lview = qobject_cast<QListView*>(view);
    if (lview)
        return 2 * lview->spacing(); // QListView::spacing is the padding around the item.
#if QT_CONFIG(tableview)
    QTableView *tview = qobject_cast<QTableView*>(view);
    if (tview)
        return tview->showGrid() ? 1 : 0;
#endif
    return 0;
}